

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

double add_regularization<sparse_parameters>
                 (vw *all,bfgs *b,float regularization,sparse_parameters *weights)

{
  _Hash_node_base *p_Var1;
  long lVar2;
  _Hash_node_base *p_Var3;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var4;
  byte bVar5;
  weight *pwVar6;
  ulong uVar7;
  float fVar8;
  double dVar9;
  uint64_t index;
  ulong local_60;
  double local_58;
  double local_50;
  double local_48;
  ulong local_40;
  float *local_38;
  
  pwVar6 = b->regularizers;
  if (pwVar6 == (weight *)0x0) {
    p_Var3 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var3 != (_Hash_node_base *)0x0) {
      local_48 = 0.0;
      do {
        p_Var1 = p_Var3[2]._M_nxt;
        *(float *)((long)&p_Var1->_M_nxt + 4) =
             *(float *)&p_Var1->_M_nxt * regularization + *(float *)((long)&p_Var1->_M_nxt + 4);
        p_Var1 = p_Var3 + 2;
        p_Var3 = p_Var3->_M_nxt;
        dVar9 = (double)*(float *)&p_Var1->_M_nxt->_M_nxt;
        local_48 = local_48 + (double)regularization * 0.5 * dVar9 * dVar9;
      } while (p_Var3 != (_Hash_node_base *)0x0);
      goto LAB_001a879f;
    }
  }
  else {
    p_Var3 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var3 != (_Hash_node_base *)0x0) {
      local_48 = 0.0;
      do {
        uVar7 = (ulong)p_Var3[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
        p_Var1 = p_Var3[2]._M_nxt;
        fVar8 = *(float *)&p_Var1->_M_nxt - pwVar6[uVar7 * 2 + 1];
        *(float *)((long)&p_Var1->_M_nxt + 4) =
             pwVar6[uVar7 * 2] * fVar8 + *(float *)((long)&p_Var1->_M_nxt + 4);
        pwVar6 = b->regularizers;
        dVar9 = (double)fVar8;
        local_48 = local_48 + (double)pwVar6[uVar7 * 2] * 0.5 * dVar9 * dVar9;
        p_Var3 = p_Var3->_M_nxt;
      } while (p_Var3 != (_Hash_node_base *)0x0);
      goto LAB_001a879f;
    }
  }
  local_48 = 0.0;
LAB_001a879f:
  if (all->no_bias == true) {
    bVar5 = (byte)weights->_stride_shift;
    if (b->regularizers == (weight *)0x0) {
      local_58 = (double)CONCAT44(local_58._4_4_,regularization);
      local_60 = 0xb1c55cL << (bVar5 & 0x3f) & weights->_weight_mask;
      _Var4._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_60);
      if (_Var4._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
        local_40 = local_60;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)weights);
        _Var4._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_60);
        if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*weights->fun)(*(weight **)((long)_Var4._M_cur + 0x10),weights->default_data);
        }
      }
      local_50 = (double)CONCAT44(local_50._4_4_,
                                  **(undefined4 **)
                                    ((long)&((_Var4._M_cur)->
                                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                            ._M_storage._M_storage + 8));
      local_60 = 0xb1c55cL << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask;
      _Var4._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_60);
      if (_Var4._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
        local_40 = local_60;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)weights);
        _Var4._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_60);
        if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*weights->fun)(*(weight **)((long)_Var4._M_cur + 0x10),weights->default_data);
        }
      }
      lVar2 = *(long *)((long)&((_Var4._M_cur)->
                               super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                               ._M_storage._M_storage + 8);
      *(float *)(lVar2 + 4) = *(float *)(lVar2 + 4) - local_50._0_4_ * local_58._0_4_;
      local_60 = 0xb1c55cL << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask;
      _Var4._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_60);
      if (_Var4._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
        local_40 = local_60;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)weights);
        _Var4._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_60);
        if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*weights->fun)(*(weight **)((long)_Var4._M_cur + 0x10),weights->default_data);
        }
      }
      local_58 = (double)local_58._0_4_;
      local_50 = (double)**(float **)
                           ((long)&((_Var4._M_cur)->
                                   super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                   ._M_storage._M_storage + 8);
      local_60 = 0xb1c55cL << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask;
      _Var4._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_60);
      if (_Var4._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
        local_40 = local_60;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)weights);
        _Var4._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_60);
        if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*weights->fun)(*(weight **)((long)_Var4._M_cur + 0x10),weights->default_data);
        }
      }
      local_48 = local_48 +
                 local_58 * -0.5 * local_50 *
                 (double)**(float **)
                           ((long)&((_Var4._M_cur)->
                                   super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                   ._M_storage._M_storage + 8);
    }
    else {
      uVar7 = 0xb1c55cL >> (bVar5 & 0x3f);
      local_60 = 0xb1c55cL << (bVar5 & 0x3f) & weights->_weight_mask;
      _Var4._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_60);
      if (_Var4._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
        local_40 = local_60;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)weights);
        _Var4._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_60);
        if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*weights->fun)(*(weight **)((long)_Var4._M_cur + 0x10),weights->default_data);
        }
      }
      local_58 = (double)CONCAT44(local_58._4_4_,
                                  **(float **)
                                    ((long)&((_Var4._M_cur)->
                                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                            ._M_storage._M_storage + 8) -
                                  b->regularizers[uVar7 * 2 + 1]);
      local_50 = (double)CONCAT44(local_50._4_4_,b->regularizers[uVar7 * 2]);
      local_60 = 0xb1c55cL << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask;
      _Var4._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_60);
      if (_Var4._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
        local_40 = local_60;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)weights);
        _Var4._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_60);
        if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*weights->fun)(*(weight **)((long)_Var4._M_cur + 0x10),weights->default_data);
        }
      }
      lVar2 = *(long *)((long)&((_Var4._M_cur)->
                               super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                               ._M_storage._M_storage + 8);
      *(float *)(lVar2 + 4) = *(float *)(lVar2 + 4) - local_50._0_4_ * local_58._0_4_;
      local_48 = local_48 +
                 (double)b->regularizers[(uint)((int)uVar7 * 2)] * -0.5 * (double)local_58._0_4_ *
                 (double)local_58._0_4_;
    }
  }
  return local_48;
}

Assistant:

double add_regularization(vw& all, bfgs& b, float regularization, T& weights)
{
  // compute the derivative difference
  double ret = 0.;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_GT] += regularization * (*w);
      ret += 0.5 * regularization * (*w) * (*w);
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      weight delta_weight = *w - b.regularizers[2 * i + 1];
      (&(*w))[W_GT] += b.regularizers[2 * i] * delta_weight;
      ret += 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }

  // if we're not regularizing the intercept term, then subtract it off from the result above
  // when accessing weights[constant], always use weights.strided_index(constant)
  if (all.no_bias)
  {
    if (b.regularizers == nullptr)
    {
      (&weights.strided_index(constant))[W_GT] -= regularization * (weights.strided_index(constant));
      ret -= 0.5 * regularization * (weights.strided_index(constant)) * (weights.strided_index(constant));
    }
    else
    {
      uint64_t i = constant >> weights.stride_shift();
      weight delta_weight = (weights.strided_index(constant)) - b.regularizers[2 * i + 1];
      (&weights.strided_index(constant))[W_GT] -= b.regularizers[2 * i] * delta_weight;
      ret -= 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }
  }

  return ret;
}